

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_goto(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  ROOM_INDEX_DATA *pRoomIndex;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var3;
  CHAR_DATA *unaff_retaddr;
  int count;
  CHAR_DATA *rch;
  ROOM_INDEX_DATA *location;
  char *in_stack_00005c20;
  CHAR_DATA *in_stack_00005c28;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *ch_00;
  uint in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  int iVar5;
  char *in_stack_ffffffffffffffe0;
  CHAR_DATA *pCVar6;
  
  uVar4 = 0;
  if (*in_RSI == '\0') {
    send_to_char(in_stack_ffffffffffffffe0,(CHAR_DATA *)(ulong)in_stack_ffffffffffffffd8);
  }
  else {
    pRoomIndex = find_location((CHAR_DATA *)(ulong)in_stack_ffffffffffffffd8,
                               in_stack_ffffffffffffffd0);
    if (pRoomIndex == (ROOM_INDEX_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffffe0,(CHAR_DATA *)CONCAT44(uVar4,in_stack_ffffffffffffffd8))
      ;
    }
    else {
      iVar5 = 0;
      for (pCVar6 = pRoomIndex->people; pCVar6 != (CHAR_DATA *)0x0; pCVar6 = pCVar6->next_in_room) {
        iVar5 = iVar5 + 1;
      }
      bVar1 = is_room_owner((CHAR_DATA *)
                            CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                            (ROOM_INDEX_DATA *)0x589023);
      if (((bVar1) || (bVar1 = room_is_private(pRoomIndex), !bVar1)) ||
         ((iVar5 < 2 && (0x3b < in_RDI->level)))) {
        ch_00 = (CHAR_DATA *)pRoomIndex->room_flags[0];
        _Var3 = std::pow<int,int>(0,0x589085);
        if ((((ulong)ch_00 & (long)_Var3) == 0) ||
           (iVar2 = get_trust((CHAR_DATA *)
                              CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)),
           0x3b < iVar2)) {
          if (in_RDI->fighting != (CHAR_DATA *)0x0) {
            stop_fighting(ch_00,(bool)in_stack_ffffffffffffffcf);
          }
          for (pCVar6 = in_RDI->in_room->people; pCVar6 != (CHAR_DATA *)0x0;
              pCVar6 = pCVar6->next_in_room) {
            iVar2 = get_trust((CHAR_DATA *)
                              CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
            if ((in_RDI->invis_level <= iVar2) &&
               (((iVar2 = get_trust((CHAR_DATA *)
                                    CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)),
                 iVar2 != 0x33 || (in_RDI->invis_level != 0x33)) ||
                (bVar1 = is_heroimm((CHAR_DATA *)
                                    CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)),
                bVar1)))) {
              if (((in_RDI->pcdata == (PC_DATA *)0x0) || (*in_RDI->pcdata->bamfout == '\0')) ||
                 (bVar1 = is_switched(in_RDI), bVar1)) {
                act((char *)pCVar6,(CHAR_DATA *)CONCAT44(iVar5,in_stack_ffffffffffffffd8),ch_00,
                    (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
              }
              else {
                act((char *)pCVar6,(CHAR_DATA *)CONCAT44(iVar5,in_stack_ffffffffffffffd8),ch_00,
                    (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
              }
            }
          }
          char_from_room((CHAR_DATA *)location);
          char_to_room(unaff_retaddr,(ROOM_INDEX_DATA *)in_RDI);
          for (pCVar6 = in_RDI->in_room->people; pCVar6 != (CHAR_DATA *)0x0;
              pCVar6 = pCVar6->next_in_room) {
            iVar2 = get_trust((CHAR_DATA *)
                              CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
            if ((in_RDI->invis_level <= iVar2) &&
               (((iVar2 = get_trust((CHAR_DATA *)
                                    CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)),
                 iVar2 != 0x33 || (in_RDI->invis_level != 0x33)) ||
                (bVar1 = is_heroimm((CHAR_DATA *)
                                    CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)),
                bVar1)))) {
              if (((in_RDI->pcdata == (PC_DATA *)0x0) || (*in_RDI->pcdata->bamfin == '\0')) ||
                 (bVar1 = is_switched(in_RDI), bVar1)) {
                act((char *)pCVar6,(CHAR_DATA *)CONCAT44(iVar5,in_stack_ffffffffffffffd8),ch_00,
                    (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
              }
              else {
                act((char *)pCVar6,(CHAR_DATA *)CONCAT44(iVar5,in_stack_ffffffffffffffd8),ch_00,
                    (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
              }
            }
          }
          do_look(in_stack_00005c28,in_stack_00005c20);
        }
        else {
          send_to_char((char *)pCVar6,(CHAR_DATA *)CONCAT44(iVar5,in_stack_ffffffffffffffd8));
        }
      }
      else {
        send_to_char((char *)pCVar6,(CHAR_DATA *)CONCAT44(iVar5,in_stack_ffffffffffffffd8));
      }
    }
  }
  return;
}

Assistant:

void do_goto(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *location;
	CHAR_DATA *rch;
	int count = 0;

	if (argument[0] == '\0')
	{
		send_to_char("Goto where?\n\r", ch);
		return;
	}

	location = find_location(ch, argument);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	count = 0;

	for (rch = location->people; rch != nullptr; rch = rch->next_in_room)
	{
		count++;
	}

	if (!is_room_owner(ch, location) && room_is_private(location) && (count > 1 || ch->level < MAX_LEVEL))
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (IS_SET(location->room_flags, ROOM_IMP_ONLY) && get_trust(ch) < 60)
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
		stop_fighting(ch, true);

	for (rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (get_trust(rch) >= ch->invis_level)
		{
			if (get_trust(rch) == LEVEL_HERO && ch->invis_level == LEVEL_HERO && !is_heroimm(rch))
				continue;

			if (ch->pcdata != nullptr && ch->pcdata->bamfout[0] != '\0' && !is_switched(ch))
				act("$t", ch, ch->pcdata->bamfout, rch, TO_VICT);
			else
				act("$n leaves in a swirling mist.", ch, nullptr, rch, TO_VICT);
		}
	}

	char_from_room(ch);
	char_to_room(ch, location);

	for (rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (get_trust(rch) >= ch->invis_level)
		{
			if (get_trust(rch) == LEVEL_HERO && ch->invis_level == LEVEL_HERO && !is_heroimm(rch))
				continue;

			if (ch->pcdata != nullptr && ch->pcdata->bamfin[0] != '\0' && !is_switched(ch))
				act("$t", ch, ch->pcdata->bamfin, rch, TO_VICT);
			else
				act("$n appears in a swirling mist.", ch, nullptr, rch, TO_VICT);
		}
	}

	do_look(ch, "auto");
}